

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_same_stdout_stderr(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t local_328;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  
  init_process_options("spawn_helper3",exit_cb);
  local_328 = uv_buf_init("TEST",4);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&out,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 2;
  stdio[0].data.stream = (uv_stream_t *)&in;
  stdio[1].data.stream = (uv_stream_t *)&out;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_process_kill(&process,0);
    if (iVar1 == 0) {
      iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&local_328,1,write_cb);
      if (iVar1 == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
        if (iVar1 == 0) {
          if (exit_cb_called == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              if (exit_cb_called == 1) {
                iVar1 = bcmp(output,"TEST",5);
                if (iVar1 == 0) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0x3ea;
                }
                else {
                  pcVar4 = "strcmp(output, \"TEST\") == 0";
                  uVar3 = 1000;
                }
              }
              else {
                pcVar4 = "exit_cb_called == 1";
                uVar3 = 999;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x3e5;
            }
          }
          else {
            pcVar4 = "exit_cb_called == 0";
            uVar3 = 0x3e2;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x3e0;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x3dd;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x3da;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x3d4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&out, on_alloc, on_read);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(strcmp(output, "TEST") == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}